

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Icosahedron.cpp
# Opt level: O1

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Icosahedron::ih
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Icosahedron *this,int n)

{
  uint i;
  long lVar1;
  uint i_2;
  pointer pVVar2;
  pointer ppVar3;
  int iVar4;
  pointer ptVar5;
  int k;
  int iVar6;
  int j;
  int iVar7;
  int iVar8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *pvVar9;
  double dVar10;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_10;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_14;
  Vector<double,_3U> result_18;
  double local_188 [4];
  double local_168 [4];
  Vector3<double> local_148;
  Vector3<double> local_128;
  double local_108 [4];
  Vector3<double> local_e8;
  double local_c8 [4];
  double local_a8 [3];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_90;
  double local_88;
  Icosahedron *local_80;
  double local_78 [3];
  pointer local_60;
  pointer local_58;
  double local_50;
  double local_48 [3];
  
  if (n < 0) {
    pvVar9 = &this->Points;
  }
  else if (n == 0) {
    pvVar9 = &this->Points;
    local_e8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_e8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
    std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
    emplace_back<OpenMD::Vector3<double>>
              ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)pvVar9,
               &local_e8);
  }
  else {
    pVVar2 = (this->Basis).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_90 = __return_storage_ptr__;
    if (pVVar2 != (this->Basis).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_188[3] = (double)n;
      do {
        local_188[0] = 0.0;
        local_188[1] = 0.0;
        local_188[2] = 0.0;
        lVar1 = 0;
        do {
          local_188[lVar1] = (pVVar2->super_Vector<double,_3U>).data_[lVar1] * local_188[3];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        local_e8.super_Vector<double,_3U>.data_[2] = local_188[2];
        local_e8.super_Vector<double,_3U>.data_[0] = local_188[0];
        local_e8.super_Vector<double,_3U>.data_[1] = local_188[1];
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   &this->Points,&local_e8);
        pVVar2 = pVVar2 + 1;
      } while (pVVar2 != (this->Basis).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (1 < n) {
      ppVar3 = (this->Edges).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_80 = this;
      if (ppVar3 != (this->Edges).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        local_88 = (double)n;
        do {
          iVar7 = ppVar3->first;
          pVVar2 = (local_80->Basis).
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_188[0] = 0.0;
          local_188[1] = 0.0;
          local_188[2] = 0.0;
          lVar1 = 0;
          do {
            local_188[lVar1] = pVVar2[iVar7].super_Vector<double,_3U>.data_[lVar1] * local_88;
            lVar1 = lVar1 + 1;
          } while (lVar1 != 3);
          local_e8.super_Vector<double,_3U>.data_[2] = local_188[2];
          local_e8.super_Vector<double,_3U>.data_[0] = local_188[0];
          local_e8.super_Vector<double,_3U>.data_[1] = local_188[1];
          iVar7 = ppVar3->second;
          local_128.super_Vector<double,_3U>.data_[0] = 0.0;
          local_128.super_Vector<double,_3U>.data_[1] = 0.0;
          local_128.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar1 = 0;
          do {
            local_128.super_Vector<double,_3U>.data_[lVar1] =
                 pVVar2[iVar7].super_Vector<double,_3U>.data_[lVar1] * local_88;
            lVar1 = lVar1 + 1;
          } while (lVar1 != 3);
          local_188[2] = local_128.super_Vector<double,_3U>.data_[2];
          local_188[0] = local_128.super_Vector<double,_3U>.data_[0];
          local_188[1] = local_128.super_Vector<double,_3U>.data_[1];
          iVar7 = 1;
          dVar10 = 1.0;
          do {
            local_168[0] = 0.0;
            local_168[1] = 0.0;
            local_168[2] = 0.0;
            lVar1 = 0;
            do {
              local_168[lVar1] = local_188[lVar1] - local_e8.super_Vector<double,_3U>.data_[lVar1];
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_148.super_Vector<double,_3U>.data_[0] = 0.0;
            local_148.super_Vector<double,_3U>.data_[1] = 0.0;
            local_148.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar1 = 0;
            do {
              local_148.super_Vector<double,_3U>.data_[lVar1] = local_168[lVar1] * dVar10;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_a8[0] = 0.0;
            local_a8[1] = 0.0;
            local_a8[2] = 0.0;
            lVar1 = 0;
            do {
              local_a8[lVar1] = local_148.super_Vector<double,_3U>.data_[lVar1] / local_88;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_108[0] = 0.0;
            local_108[1] = 0.0;
            local_108[2] = 0.0;
            lVar1 = 0;
            do {
              local_108[lVar1] = local_e8.super_Vector<double,_3U>.data_[lVar1] + local_a8[lVar1];
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_128.super_Vector<double,_3U>.data_[2] = local_108[2];
            local_128.super_Vector<double,_3U>.data_[0] = local_108[0];
            local_128.super_Vector<double,_3U>.data_[1] = local_108[1];
            local_188[3] = dVar10;
            std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
            emplace_back<OpenMD::Vector3<double>>
                      ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                       &this->Points,&local_128);
            dVar10 = local_188[3] + 1.0;
            iVar7 = iVar7 + 1;
          } while (iVar7 != n);
          ppVar3 = ppVar3 + 1;
        } while (ppVar3 != (local_80->Edges).
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      this = local_80;
      if (n != 2) {
        ptVar5 = (local_80->Facets).
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_60 = (local_80->Facets).
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ptVar5 != local_60) {
          local_50 = (double)n;
          iVar7 = 3;
          if (3 < n) {
            iVar7 = n;
          }
          pvVar9 = &local_80->Points;
          do {
            iVar4 = (ptVar5->super__Tuple_impl<0UL,_int,_int,_int>).
                    super__Head_base<0UL,_int,_false>._M_head_impl;
            pVVar2 = (local_80->Basis).
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            lVar1 = 0;
            do {
              local_188[lVar1] = pVVar2[iVar4].super_Vector<double,_3U>.data_[lVar1] * local_50;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_e8.super_Vector<double,_3U>.data_[2] = local_188[2];
            local_e8.super_Vector<double,_3U>.data_[0] = local_188[0];
            local_e8.super_Vector<double,_3U>.data_[1] = local_188[1];
            iVar4 = (ptVar5->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>
                    .super__Head_base<1UL,_int,_false>._M_head_impl;
            local_128.super_Vector<double,_3U>.data_[0] = 0.0;
            local_128.super_Vector<double,_3U>.data_[1] = 0.0;
            local_128.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar1 = 0;
            do {
              local_128.super_Vector<double,_3U>.data_[lVar1] =
                   pVVar2[iVar4].super_Vector<double,_3U>.data_[lVar1] * local_50;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_188[2] = local_128.super_Vector<double,_3U>.data_[2];
            local_188[0] = local_128.super_Vector<double,_3U>.data_[0];
            local_188[1] = local_128.super_Vector<double,_3U>.data_[1];
            iVar4 = (ptVar5->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>
                    .super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
            local_108[0] = 0.0;
            local_108[1] = 0.0;
            local_108[2] = 0.0;
            lVar1 = 0;
            do {
              local_108[lVar1] = pVVar2[iVar4].super_Vector<double,_3U>.data_[lVar1] * local_50;
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            local_128.super_Vector<double,_3U>.data_[2] = local_108[2];
            local_128.super_Vector<double,_3U>.data_[0] = local_108[0];
            local_128.super_Vector<double,_3U>.data_[1] = local_108[1];
            iVar4 = 1;
            iVar8 = 2;
            local_58 = ptVar5;
            do {
              local_c8[0] = 0.0;
              local_c8[1] = 0.0;
              local_c8[2] = 0.0;
              lVar1 = 0;
              do {
                local_c8[lVar1] = local_188[lVar1] - local_e8.super_Vector<double,_3U>.data_[lVar1];
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              iVar4 = iVar4 + 1;
              local_88 = (double)iVar4;
              local_168[0] = 0.0;
              local_168[1] = 0.0;
              local_168[2] = 0.0;
              lVar1 = 0;
              do {
                local_168[lVar1] = local_c8[lVar1] * local_88;
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_148.super_Vector<double,_3U>.data_[0] = 0.0;
              local_148.super_Vector<double,_3U>.data_[1] = 0.0;
              local_148.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar1 = 0;
              do {
                local_148.super_Vector<double,_3U>.data_[lVar1] = local_168[lVar1] / local_50;
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_a8[0] = 0.0;
              local_a8[1] = 0.0;
              local_a8[2] = 0.0;
              lVar1 = 0;
              do {
                local_a8[lVar1] =
                     local_e8.super_Vector<double,_3U>.data_[lVar1] +
                     local_148.super_Vector<double,_3U>.data_[lVar1];
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_108[2] = local_a8[2];
              local_108[0] = local_a8[0];
              local_108[1] = local_a8[1];
              local_78[0] = 0.0;
              local_78[1] = 0.0;
              local_78[2] = 0.0;
              lVar1 = 0;
              do {
                local_78[lVar1] =
                     local_128.super_Vector<double,_3U>.data_[lVar1] -
                     local_e8.super_Vector<double,_3U>.data_[lVar1];
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_c8[0] = 0.0;
              local_c8[1] = 0.0;
              local_c8[2] = 0.0;
              lVar1 = 0;
              do {
                local_c8[lVar1] = local_78[lVar1] * local_88;
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_168[0] = 0.0;
              local_168[1] = 0.0;
              local_168[2] = 0.0;
              lVar1 = 0;
              do {
                local_168[lVar1] = local_c8[lVar1] / local_50;
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_148.super_Vector<double,_3U>.data_[0] = 0.0;
              local_148.super_Vector<double,_3U>.data_[1] = 0.0;
              local_148.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar1 = 0;
              do {
                local_148.super_Vector<double,_3U>.data_[lVar1] =
                     local_e8.super_Vector<double,_3U>.data_[lVar1] + local_168[lVar1];
                lVar1 = lVar1 + 1;
              } while (lVar1 != 3);
              local_a8[2] = local_148.super_Vector<double,_3U>.data_[2];
              local_a8[0] = local_148.super_Vector<double,_3U>.data_[0];
              local_a8[1] = local_148.super_Vector<double,_3U>.data_[1];
              iVar6 = 1;
              dVar10 = 1.0;
              do {
                local_48[0] = 0.0;
                local_48[1] = 0.0;
                local_48[2] = 0.0;
                lVar1 = 0;
                do {
                  local_48[lVar1] = local_a8[lVar1] - local_108[lVar1];
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                local_78[0] = 0.0;
                local_78[1] = 0.0;
                local_78[2] = 0.0;
                lVar1 = 0;
                do {
                  local_78[lVar1] = local_48[lVar1] * dVar10;
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                local_c8[0] = 0.0;
                local_c8[1] = 0.0;
                local_c8[2] = 0.0;
                lVar1 = 0;
                do {
                  local_c8[lVar1] = local_78[lVar1] / local_88;
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                local_168[0] = 0.0;
                local_168[1] = 0.0;
                local_168[2] = 0.0;
                lVar1 = 0;
                do {
                  local_168[lVar1] = local_108[lVar1] + local_c8[lVar1];
                  lVar1 = lVar1 + 1;
                } while (lVar1 != 3);
                local_148.super_Vector<double,_3U>.data_[2] = local_168[2];
                local_148.super_Vector<double,_3U>.data_[0] = local_168[0];
                local_148.super_Vector<double,_3U>.data_[1] = local_168[1];
                local_188[3] = dVar10;
                std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
                emplace_back<OpenMD::Vector3<double>>
                          ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>
                            *)pvVar9,&local_148);
                dVar10 = local_188[3] + 1.0;
                iVar6 = iVar6 + 1;
              } while (iVar6 != iVar8);
              iVar8 = iVar8 + 1;
            } while (iVar8 != iVar7);
            ptVar5 = local_58 + 1;
            this = local_80;
          } while (ptVar5 != local_60);
        }
      }
    }
    pvVar9 = &this->Points;
    __return_storage_ptr__ = local_90;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (__return_storage_ptr__,pvVar9);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector3d> Icosahedron::ih(int n) {
    if (n < 0) return Points;

    if (n == 0) {
      // center particle only

      Points.push_back(Vector3d(0.0, 0.0, 0.0));
      return Points;
    }

    //
    // Generate edge particles
    //
    for (std::vector<Vector3d>::iterator i = Basis.begin(); i != Basis.end();
         ++i) {
      Points.push_back((*i) * RealType(n));
    }

    //
    // Generate side particles
    //
    if (n < 2) return Points;

    for (std::vector<std::pair<int, int>>::iterator i = Edges.begin();
         i != Edges.end(); ++i) {
      Vector3d e1 = Basis[(*i).first] * RealType(n);
      Vector3d e2 = Basis[(*i).second] * RealType(n);

      for (int j = 1; j <= n - 1; j++) {
        Points.push_back(e1 + (e2 - e1) * RealType(j) / RealType(n));
      }
    }

    //
    // Generate body particles
    //
    if (n < 3) return Points;

    for (const auto& [first, second, third] : Facets) {
      Vector3d e1 = Basis[first] * RealType(n);
      Vector3d e2 = Basis[second] * RealType(n);
      Vector3d e3 = Basis[third] * RealType(n);

      for (int j = 1; j <= n - 2; j++) {
        Vector3d v1 = e1 + (e2 - e1) * RealType(j + 1) / RealType(n);
        Vector3d v2 = e1 + (e3 - e1) * RealType(j + 1) / RealType(n);

        for (int k = 1; k <= j; k++) {
          Points.push_back(v1 + (v2 - v1) * RealType(k) / RealType(j + 1));
        }
      }
    }

    return Points;
  }